

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutput.cpp
# Opt level: O0

void __thiscall TestOutput::printTestsEnded(TestOutput *this,TestResult *result)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  TestResult *in_RSI;
  long *in_RDI;
  size_t failureCount;
  bool isFailure;
  
  (**(code **)(*in_RDI + 0x58))(in_RDI,"\n");
  bVar1 = TestResult::isFailure(in_RSI);
  sVar2 = TestResult::getFailureCount(in_RSI);
  if (bVar1) {
    if ((*(byte *)(in_RDI + 2) & 1) != 0) {
      (**(code **)(*in_RDI + 0x58))(in_RDI,"\x1b[31;1m");
    }
    (**(code **)(*in_RDI + 0x58))(in_RDI,"Errors (");
    if (sVar2 == 0) {
      (**(code **)(*in_RDI + 0x58))(in_RDI,"ran nothing, ");
    }
    else {
      (**(code **)(*in_RDI + 0x68))(in_RDI,sVar2);
      (**(code **)(*in_RDI + 0x58))(in_RDI," failures, ");
    }
  }
  else {
    if ((*(byte *)(in_RDI + 2) & 1) != 0) {
      (**(code **)(*in_RDI + 0x58))(in_RDI,"\x1b[32;1m");
    }
    (**(code **)(*in_RDI + 0x58))(in_RDI,"OK (");
  }
  sVar3 = TestResult::getTestCount(in_RSI);
  (**(code **)(*in_RDI + 0x68))(in_RDI,sVar3);
  (**(code **)(*in_RDI + 0x58))(in_RDI," tests, ");
  sVar3 = TestResult::getRunCount(in_RSI);
  (**(code **)(*in_RDI + 0x68))(in_RDI,sVar3);
  (**(code **)(*in_RDI + 0x58))(in_RDI," ran, ");
  sVar3 = TestResult::getCheckCount(in_RSI);
  (**(code **)(*in_RDI + 0x68))(in_RDI,sVar3);
  (**(code **)(*in_RDI + 0x58))(in_RDI," checks, ");
  sVar3 = TestResult::getIgnoredCount(in_RSI);
  (**(code **)(*in_RDI + 0x68))(in_RDI,sVar3);
  (**(code **)(*in_RDI + 0x58))(in_RDI," ignored, ");
  sVar3 = TestResult::getFilteredOutCount(in_RSI);
  (**(code **)(*in_RDI + 0x68))(in_RDI,sVar3);
  (**(code **)(*in_RDI + 0x58))(in_RDI," filtered out, ");
  sVar3 = TestResult::getTotalExecutionTime(in_RSI);
  (**(code **)(*in_RDI + 0x68))(in_RDI,sVar3);
  (**(code **)(*in_RDI + 0x58))(in_RDI," ms)");
  if ((*(byte *)(in_RDI + 2) & 1) != 0) {
    (**(code **)(*in_RDI + 0x58))(in_RDI,"\x1b[m");
  }
  if ((bVar1) && (sVar2 == 0)) {
    (**(code **)(*in_RDI + 0x58))
              (in_RDI,
               "\nNote: test run failed because no tests were run or ignored. Assuming something went wrong. This often happens because of linking errors or typos in test filter."
              );
  }
  (**(code **)(*in_RDI + 0x58))(in_RDI,"\n\n");
  *(undefined4 *)(in_RDI + 1) = 0;
  return;
}

Assistant:

void TestOutput::printTestsEnded(const TestResult& result)
{
    print("\n");
    const bool isFailure = result.isFailure();
    const size_t failureCount = result.getFailureCount();
    if (isFailure) {
        if (color_) {
            print("\033[31;1m");
        }
        print("Errors (");
        if (failureCount > 0) {
            print(failureCount);
            print(" failures, ");
        }
        else {
            print("ran nothing, ");
        }
    }
    else {
        if (color_) {
            print("\033[32;1m");
        }
        print("OK (");
    }
    print(result.getTestCount());
    print(" tests, ");
    print(result.getRunCount());
    print(" ran, ");
    print(result.getCheckCount());
    print(" checks, ");
    print(result.getIgnoredCount());
    print(" ignored, ");
    print(result.getFilteredOutCount());
    print(" filtered out, ");
    print(result.getTotalExecutionTime());
    print(" ms)");
    if (color_) {
        print("\033[m");
    }
    if (isFailure && failureCount == 0) {
        print("\nNote: test run failed because no tests were run or ignored. Assuming something went wrong. "
              "This often happens because of linking errors or typos in test filter.");
    }
    print("\n\n");

    dotCount_ = 0;
}